

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.hpp
# Opt level: O2

void duckdb::BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::Free(ART *art,Node *node)

{
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *pBVar1;
  uint8_t i;
  ulong uVar2;
  Node *node_00;
  
  pBVar1 = Node::Ref<duckdb::BaseNode<(unsigned_char)16,(duckdb::NType)4>>
                     (art,(Node)(node->super_IndexPointer).data,NODE_16);
  node_00 = pBVar1->children;
  for (uVar2 = 0; uVar2 < pBVar1->count; uVar2 = uVar2 + 1) {
    Node::Free(art,node_00);
    node_00 = node_00 + 1;
  }
  return;
}

Assistant:

static void Free(ART &art, Node &node) {
		auto &n = Node::Ref<BaseNode>(art, node, TYPE);
		for (uint8_t i = 0; i < n.count; i++) {
			Node::Free(art, n.children[i]);
		}
	}